

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

void __thiscall
cmCMakePresetsGraph::PrintWorkflowPresetList
          (cmCMakePresetsGraph *this,PrintPrecedingNewline *newline)

{
  pointer pbVar1;
  mapped_type *pmVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  pointer __k;
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  presets;
  vector<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  local_58;
  mapped_type *local_38;
  
  local_58.
  super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __k = (this->WorkflowPresetOrder).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->WorkflowPresetOrder).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar1) {
    do {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
               ::at(&this->WorkflowPresets,__k);
      if ((((pmVar2->Unexpanded).super_Preset.Hidden == false) &&
          ((pmVar2->Expanded).
           super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>._M_payload.
           super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>.
           super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._M_engaged == true)) &&
         ((pmVar2->Expanded).super__Optional_base<cmCMakePresetsGraph::WorkflowPreset,_false,_false>
          ._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::WorkflowPreset,_true,_false,_false>.
          super__Optional_payload_base<cmCMakePresetsGraph::WorkflowPreset>._M_payload.field2[0xa0]
          == '\x01')) {
        local_38 = pmVar2;
        std::
        vector<cmCMakePresetsGraph::Preset_const*,std::allocator<cmCMakePresetsGraph::Preset_const*>>
        ::emplace_back<cmCMakePresetsGraph::Preset_const*>
                  ((vector<cmCMakePresetsGraph::Preset_const*,std::allocator<cmCMakePresetsGraph::Preset_const*>>
                    *)&local_58,(Preset **)&local_38);
      }
      __k = __k + 1;
    } while (__k != pbVar1);
  }
  if (local_58.
      super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    printPrecedingNewline(newline);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Available workflow presets:\n\n",0x1d);
    PrintPresets(&local_58);
  }
  if (local_58.
      super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_cmCMakePresetsGraph::Preset_*,_std::allocator<const_cmCMakePresetsGraph::Preset_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintWorkflowPresetList(
  PrintPrecedingNewline* newline) const
{
  std::vector<const cmCMakePresetsGraph::Preset*> presets;
  for (auto const& p : this->WorkflowPresetOrder) {
    auto const& preset = this->WorkflowPresets.at(p);
    if (!preset.Unexpanded.Hidden && preset.Expanded &&
        preset.Expanded->ConditionResult) {
      presets.push_back(
        static_cast<const cmCMakePresetsGraph::Preset*>(&preset.Unexpanded));
    }
  }

  if (!presets.empty()) {
    printPrecedingNewline(newline);
    std::cout << "Available workflow presets:\n\n";
    cmCMakePresetsGraph::PrintPresets(presets);
  }
}